

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::GetArrayCopy<aiMeshMorphKey>(aiMeshMorphKey **dest,ai_uint num)

{
  aiMeshMorphKey *__src;
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  aiMeshMorphKey *paVar5;
  ulong uVar6;
  aiMeshMorphKey *local_38;
  aiMeshMorphKey *old;
  ai_uint num_local;
  aiMeshMorphKey **dest_local;
  
  if (*dest != (aiMeshMorphKey *)0x0) {
    __src = *dest;
    uVar2 = CONCAT44(0,num);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x20),0);
    uVar6 = uVar3 + 8;
    if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar3) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar4 = (ulong *)operator_new__(uVar6);
    *puVar4 = uVar2;
    paVar5 = (aiMeshMorphKey *)(puVar4 + 1);
    if (uVar2 != 0) {
      local_38 = paVar5;
      do {
        aiMeshMorphKey::aiMeshMorphKey(local_38);
        local_38 = local_38 + 1;
      } while (local_38 != paVar5 + uVar2);
    }
    *dest = paVar5;
    memcpy(*dest,__src,(ulong)num << 5);
  }
  return;
}

Assistant:

inline
void GetArrayCopy(Type*& dest, ai_uint num ) {
    if ( !dest ) {
        return;
    }
    Type* old = dest;

    dest = new Type[num];
    ::memcpy(dest, old, sizeof(Type) * num);
}